

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdvariablebyte.h
# Opt level: O3

string * __thiscall
FastPForLib::MaskedVByte::name_abi_cxx11_(string *__return_storage_ptr__,MaskedVByte *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"MaskedVByte","")
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return "MaskedVByte"; }